

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

bool __thiscall ON_Line::InPlane(ON_Line *this,ON_Plane *plane,double tolerance)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined1 local_70 [8];
  ON_3dVector Y;
  ON_3dVector X;
  undefined1 auStack_38 [4];
  bool rc;
  bool bTinyZ;
  bool bTinyY;
  bool bTinyX;
  ON_3dVector v;
  double tolerance_local;
  ON_Plane *plane_local;
  ON_Line *this_local;
  
  v.z = tolerance;
  ON_3dPoint::operator-((ON_3dVector *)auStack_38,&this->to,&this->from);
  bVar3 = ABS(_auStack_38) <= v.z;
  bVar1 = ABS(v.x) <= v.z;
  bVar2 = ABS(v.y) <= v.z;
  X.z._4_1_ = true;
  if ((!bVar2) || ((bVar3 && (bVar1)))) {
    if ((!bVar3) || ((bVar1 && (bVar2)))) {
      if ((!bVar1) || ((bVar2 && (bVar3)))) {
        Y.z = _auStack_38;
        ON_3dVector::Unitize((ON_3dVector *)&Y.z);
        ON_3dVector::PerpendicularTo((ON_3dVector *)local_70,(ON_3dVector *)&Y.z);
        if ((bVar3) && ((bVar1 && (bVar2)))) {
          X.z._4_1_ = false;
          bVar3 = ON_3dVector::IsZero((ON_3dVector *)&Y.z);
          if (bVar3) {
            Y.z = ON_3dVector::XAxis.x;
            local_70 = (undefined1  [8])ON_3dVector::YAxis.x;
            Y.x = ON_3dVector::YAxis.y;
            Y.y = ON_3dVector::YAxis.z;
          }
        }
      }
      else {
        Y.z = ON_3dVector::ZAxis.x;
        local_70 = (undefined1  [8])ON_3dVector::XAxis.x;
        Y.x = ON_3dVector::XAxis.y;
        Y.y = ON_3dVector::XAxis.z;
      }
    }
    else {
      Y.z = ON_3dVector::YAxis.x;
      local_70 = (undefined1  [8])ON_3dVector::ZAxis.x;
      Y.x = ON_3dVector::ZAxis.y;
      Y.y = ON_3dVector::ZAxis.z;
    }
  }
  else {
    Y.z = ON_3dVector::XAxis.x;
    local_70 = (undefined1  [8])ON_3dVector::YAxis.x;
    Y.x = ON_3dVector::YAxis.y;
    Y.y = ON_3dVector::YAxis.z;
  }
  ON_Plane::CreateFromFrame(plane,&this->from,(ON_3dVector *)&Y.z,(ON_3dVector *)local_70);
  return X.z._4_1_;
}

Assistant:

bool ON_Line::InPlane( ON_Plane& plane, double tolerance ) const
{
  const ON_3dVector v = to-from;
  const bool bTinyX = fabs(v.x) <= tolerance;
  const bool bTinyY = fabs(v.y) <= tolerance;
  const bool bTinyZ = fabs(v.z) <= tolerance;
  bool rc = true;
  ON_3dVector X;
  ON_3dVector Y;
  if ( bTinyZ && ( !bTinyX || !bTinyY ) )
  {
    X = ON_3dVector::XAxis;
    Y = ON_3dVector::YAxis;
  }
  else if ( bTinyX && ( !bTinyY || !bTinyZ ) )
  {
    X = ON_3dVector::YAxis;
    Y = ON_3dVector::ZAxis;
  }
  else if ( bTinyY && ( !bTinyZ || !bTinyX ) )
  {
    X = ON_3dVector::ZAxis;
    Y = ON_3dVector::XAxis;
  }
  else
  {
    X = v;
    X.Unitize();
    Y.PerpendicularTo(X);
    if ( bTinyX && bTinyY && bTinyZ )
    {
      rc = false;
      if ( X.IsZero() )
      {
        X = ON_3dVector::XAxis;
        Y = ON_3dVector::YAxis;
      }
    }
  }
  plane.CreateFromFrame( from, X, Y );
  return rc;
}